

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O0

void Imf_3_3::Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>(OStream *out,uint64_t v)

{
  OStream *in_RSI;
  uchar b [8];
  
  writeUnsignedChars<Imf_3_3::StreamIO,Imf_3_3::OStream>(in_RSI,(uchar *)in_RSI,0);
  return;
}

Assistant:

void
write (T& out, uint64_t v)
{
    unsigned char b[8];

    b[0] = (unsigned char) (v);
    b[1] = (unsigned char) (v >> 8);
    b[2] = (unsigned char) (v >> 16);
    b[3] = (unsigned char) (v >> 24);
    b[4] = (unsigned char) (v >> 32);
    b[5] = (unsigned char) (v >> 40);
    b[6] = (unsigned char) (v >> 48);
    b[7] = (unsigned char) (v >> 56);

    writeUnsignedChars<S> (out, b, 8);
}